

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O1

void __thiscall sqlite_orm::internal::connection_holder::retain(connection_holder *this)

{
  int iVar1;
  uint uVar2;
  system_error *this_00;
  error_category *peVar3;
  char *__what;
  sqlite3 **ppsVar4;
  error_code __ec;
  
  iVar1 = this->_retain_count;
  this->_retain_count = iVar1 + 1;
  if (iVar1 == 0) {
    ppsVar4 = &this->db;
    iVar1 = sqlite3_open((this->filename)._M_dataplus._M_p,ppsVar4);
    if (iVar1 != 0) {
      this_00 = (system_error *)__cxa_allocate_exception(0x20);
      uVar2 = sqlite3_errcode(*ppsVar4);
      peVar3 = &get_sqlite_error_category()->super_error_category;
      __what = (char *)sqlite3_errmsg(*ppsVar4);
      __ec._4_4_ = 0;
      __ec._M_value = uVar2;
      __ec._M_cat = peVar3;
      std::system_error::system_error(this_00,__ec,__what);
      __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
    }
  }
  return;
}

Assistant:

void retain() {
        ++this->_retain_count;
        if(1 == this->_retain_count) {
            auto rc = sqlite3_open(this->filename.c_str(), &this->db);
            if(rc != SQLITE_OK) {
                throw std::system_error(std::error_code(sqlite3_errcode(this->db), get_sqlite_error_category()),
                                        sqlite3_errmsg(this->db));
            }
        }
    }